

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O1

double __thiscall Quat4f::exp(Quat4f *this,double __x)

{
  long in_RSI;
  float fVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  float fVar5;
  
  fVar1 = *(float *)(in_RSI + 0xc) * *(float *)(in_RSI + 0xc) +
          *(float *)(in_RSI + 4) * *(float *)(in_RSI + 4) +
          *(float *)(in_RSI + 8) * *(float *)(in_RSI + 8);
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  dVar3 = (double)fVar1;
  if (1e-06 <= dVar3) {
    dVar4 = sin(dVar3);
    fVar2 = (float)(dVar4 / dVar3);
    dVar3 = cos(dVar3);
    fVar1 = *(float *)(in_RSI + 4) * fVar2;
    fVar5 = *(float *)(in_RSI + 8) * fVar2;
    fVar2 = fVar2 * *(float *)(in_RSI + 0xc);
  }
  else {
    dVar3 = cos(dVar3);
    fVar1 = *(float *)(in_RSI + 4);
    fVar5 = *(float *)(in_RSI + 8);
    fVar2 = *(float *)(in_RSI + 0xc);
  }
  this->m_elements[0] = (float)dVar3;
  this->m_elements[1] = fVar1;
  this->m_elements[2] = fVar5;
  this->m_elements[3] = fVar2;
  return (double)CONCAT44((int)((ulong)dVar3 >> 0x20),(float)dVar3);
}

Assistant:

Quat4f Quat4f::exp() const
{
	float theta =
		sqrt
		(
			m_elements[ 1 ] * m_elements[ 1 ] +
			m_elements[ 2 ] * m_elements[ 2 ] +
			m_elements[ 3 ] * m_elements[ 3 ]
		);

	if( theta < 1e-6 )
	{
		return Quat4f( cos( theta ), m_elements[ 1 ], m_elements[ 2 ], m_elements[ 3 ] );
	}
	else
	{
		float coeff = sin( theta ) / theta;
		return Quat4f( cos( theta ), m_elements[ 1 ] * coeff, m_elements[ 2 ] * coeff, m_elements[ 3 ] * coeff );		
	}
}